

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O0

int __thiscall agg::curve3_inc::init(curve3_inc *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double tmpy;
  double tmpx;
  double subdivide_step2;
  double subdivide_step;
  double len;
  double dy2;
  double dx2;
  double dy1;
  double dx1;
  double y3_local;
  double x3_local;
  double y2_local;
  double x2_local;
  double y1_local;
  double x1_local;
  curve3_inc *this_local;
  
  *(double *)(this + 0x10) = in_XMM0_Qa;
  *(double *)(this + 0x18) = in_XMM1_Qa;
  *(double *)(this + 0x20) = in_XMM4_Qa;
  *(double *)(this + 0x28) = in_XMM5_Qa;
  dVar2 = sqrt((in_XMM2_Qa - in_XMM0_Qa) * (in_XMM2_Qa - in_XMM0_Qa) +
               (in_XMM3_Qa - in_XMM1_Qa) * (in_XMM3_Qa - in_XMM1_Qa));
  dVar3 = sqrt((in_XMM4_Qa - in_XMM2_Qa) * (in_XMM4_Qa - in_XMM2_Qa) +
               (in_XMM5_Qa - in_XMM3_Qa) * (in_XMM5_Qa - in_XMM3_Qa));
  iVar1 = uround((dVar2 + dVar3) * 0.25 * *(double *)(this + 8));
  *(int *)this = iVar1;
  if (*(int *)this < 4) {
    *(undefined4 *)this = 4;
  }
  dVar2 = 1.0 / (double)*(int *)this;
  dVar3 = (-in_XMM2_Qa + -in_XMM2_Qa + in_XMM0_Qa + in_XMM4_Qa) * dVar2 * dVar2;
  dVar4 = (-in_XMM3_Qa + -in_XMM3_Qa + in_XMM1_Qa + in_XMM5_Qa) * dVar2 * dVar2;
  *(double *)(this + 0x30) = in_XMM0_Qa;
  *(double *)(this + 0x60) = in_XMM0_Qa;
  *(double *)(this + 0x38) = in_XMM1_Qa;
  *(double *)(this + 0x68) = in_XMM1_Qa;
  dVar5 = (in_XMM2_Qa - in_XMM0_Qa) * dVar2 * 2.0 + dVar3;
  *(double *)(this + 0x40) = dVar5;
  *(double *)(this + 0x70) = dVar5;
  dVar2 = (in_XMM3_Qa - in_XMM1_Qa) * dVar2 * 2.0 + dVar4;
  *(double *)(this + 0x48) = dVar2;
  *(double *)(this + 0x78) = dVar2;
  *(double *)(this + 0x50) = dVar3 * 2.0;
  *(double *)(this + 0x58) = dVar4 * 2.0;
  *(undefined4 *)(this + 4) = *(undefined4 *)this;
  return (int)this;
}

Assistant:

void curve3_inc::init(double x1, double y1, 
                          double x2, double y2, 
                          double x3, double y3)
    {
        m_start_x = x1;
        m_start_y = y1;
        m_end_x   = x3;
        m_end_y   = y3;

        double dx1 = x2 - x1;
        double dy1 = y2 - y1;
        double dx2 = x3 - x2;
        double dy2 = y3 - y2;

        double len = sqrt(dx1 * dx1 + dy1 * dy1) + sqrt(dx2 * dx2 + dy2 * dy2); 

        m_num_steps = uround(len * 0.25 * m_scale);

        if(m_num_steps < 4)
        {
            m_num_steps = 4;   
        }

        double subdivide_step  = 1.0 / m_num_steps;
        double subdivide_step2 = subdivide_step * subdivide_step;

        double tmpx = (x1 - x2 * 2.0 + x3) * subdivide_step2;
        double tmpy = (y1 - y2 * 2.0 + y3) * subdivide_step2;

        m_saved_fx = m_fx = x1;
        m_saved_fy = m_fy = y1;
        
        m_saved_dfx = m_dfx = tmpx + (x2 - x1) * (2.0 * subdivide_step);
        m_saved_dfy = m_dfy = tmpy + (y2 - y1) * (2.0 * subdivide_step);

        m_ddfx = tmpx * 2.0;
        m_ddfy = tmpy * 2.0;

        m_step = m_num_steps;
    }